

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void initShellData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  QMultiHash<char,_QLatin1String> local_1cd8;
  QLatin1String local_1cc8;
  char local_1cb1;
  QLatin1String local_1cb0;
  char local_1c99;
  QLatin1String local_1c98;
  char local_1c81;
  QLatin1String local_1c80;
  char local_1c69;
  QLatin1String local_1c68;
  char local_1c51;
  QLatin1String local_1c50;
  char local_1c39;
  QLatin1String local_1c38;
  char local_1c21;
  QLatin1String local_1c20;
  char local_1c09;
  QLatin1String local_1c08;
  char local_1bf1;
  QLatin1String local_1bf0;
  char local_1bd9;
  QLatin1String local_1bd8;
  char local_1bc1;
  QLatin1String local_1bc0;
  char local_1ba9;
  QLatin1String local_1ba8;
  char local_1b91;
  QLatin1String local_1b90;
  char local_1b79;
  QLatin1String local_1b78;
  char local_1b61;
  QLatin1String local_1b60;
  char local_1b49;
  QLatin1String local_1b48;
  char local_1b31;
  QLatin1String local_1b30;
  char local_1b19;
  QLatin1String local_1b18;
  char local_1b01;
  QLatin1String local_1b00;
  char local_1ae9;
  QLatin1String local_1ae8;
  char local_1ad1;
  QLatin1String local_1ad0;
  char local_1ab9;
  QLatin1String local_1ab8;
  char local_1aa1;
  QLatin1String local_1aa0;
  char local_1a89;
  QLatin1String local_1a88;
  char local_1a71;
  QLatin1String local_1a70;
  char local_1a59;
  QLatin1String local_1a58;
  char local_1a41;
  QLatin1String local_1a40;
  char local_1a29;
  QLatin1String local_1a28;
  char local_1a11;
  QLatin1String local_1a10;
  char local_19f9;
  QLatin1String local_19f8;
  char local_19e1;
  QLatin1String local_19e0;
  char local_19c9;
  QLatin1String local_19c8;
  char local_19b1;
  QLatin1String local_19b0;
  char local_1999;
  QLatin1String local_1998;
  char local_1981;
  QLatin1String local_1980;
  char local_1969;
  QLatin1String local_1968;
  char local_1951;
  QLatin1String local_1950;
  char local_1939;
  QLatin1String local_1938;
  char local_1921;
  QLatin1String local_1920;
  char local_1909;
  QLatin1String local_1908;
  char local_18f1;
  QLatin1String local_18f0;
  char local_18d9;
  QLatin1String local_18d8;
  char local_18c1;
  QLatin1String local_18c0;
  char local_18a9;
  QLatin1String local_18a8;
  char local_1891;
  QLatin1String local_1890;
  char local_1879;
  QLatin1String local_1878;
  char local_1861;
  QLatin1String local_1860;
  char local_1849;
  QLatin1String local_1848;
  char local_1831;
  QLatin1String local_1830;
  char local_1819;
  QLatin1String local_1818;
  char local_1801;
  QLatin1String local_1800;
  char local_17e9;
  QLatin1String local_17e8;
  char local_17d1;
  QLatin1String local_17d0;
  char local_17b9;
  QLatin1String local_17b8;
  char local_17a1;
  QLatin1String local_17a0;
  char local_1789;
  QLatin1String local_1788;
  char local_1771;
  QLatin1String local_1770;
  char local_1759;
  QLatin1String local_1758;
  char local_1741;
  QLatin1String local_1740;
  char local_1729;
  QLatin1String local_1728;
  char local_1711;
  QLatin1String local_1710;
  char local_16f9;
  QLatin1String local_16f8;
  char local_16e1;
  QLatin1String local_16e0;
  char local_16c9;
  QLatin1String local_16c8;
  char local_16b1;
  QLatin1String local_16b0;
  char local_1699;
  QLatin1String local_1698;
  char local_1681;
  QLatin1String local_1680;
  char local_1669;
  QLatin1String local_1668;
  char local_1651;
  QLatin1String local_1650;
  char local_1639;
  QLatin1String local_1638;
  char local_1621;
  QLatin1String local_1620;
  char local_1609;
  QLatin1String local_1608;
  char local_15f1;
  QLatin1String local_15f0;
  char local_15d9;
  QLatin1String local_15d8;
  char local_15c1;
  QLatin1String local_15c0;
  char local_15a9;
  QLatin1String local_15a8;
  char local_1591;
  QLatin1String local_1590;
  char local_1579;
  QLatin1String local_1578;
  char local_1561;
  QLatin1String local_1560;
  char local_1549;
  QLatin1String local_1548;
  char local_1531;
  QLatin1String local_1530;
  char local_1519;
  QLatin1String local_1518;
  char local_1501;
  QLatin1String local_1500;
  char local_14e9;
  QLatin1String local_14e8;
  char local_14d1;
  QLatin1String local_14d0;
  char local_14b9;
  QLatin1String local_14b8;
  char local_14a1;
  QLatin1String local_14a0;
  char local_1489;
  QLatin1String local_1488;
  char local_1471;
  QLatin1String local_1470;
  char local_1459;
  QLatin1String local_1458;
  char local_1441;
  QLatin1String local_1440;
  char local_1429;
  QLatin1String local_1428;
  char local_1411;
  QLatin1String local_1410;
  char local_13f9;
  QLatin1String local_13f8;
  char local_13e1;
  QLatin1String local_13e0;
  char local_13c9;
  QLatin1String local_13c8;
  char local_13b1;
  QLatin1String local_13b0;
  char local_1399;
  QLatin1String local_1398;
  char local_1381;
  QLatin1String local_1380;
  char local_1369;
  QLatin1String local_1368;
  char local_1351;
  QLatin1String local_1350;
  char local_1339;
  QLatin1String local_1338;
  char local_1321;
  QLatin1String local_1320;
  char local_1309;
  QLatin1String local_1308;
  char local_12f1;
  QLatin1String local_12f0;
  char local_12d9;
  QLatin1String local_12d8;
  char local_12c1;
  QLatin1String local_12c0;
  char local_12a9;
  QLatin1String local_12a8;
  char local_1291;
  QLatin1String local_1290;
  char local_1279;
  QLatin1String local_1278;
  char local_1261;
  QLatin1String local_1260;
  char local_1249;
  QLatin1String local_1248;
  char local_1231;
  QLatin1String local_1230;
  char local_1219;
  QLatin1String local_1218;
  char local_1201;
  QLatin1String local_1200;
  char local_11e9;
  QLatin1String local_11e8;
  char local_11d1;
  QLatin1String local_11d0;
  char local_11b9;
  QLatin1String local_11b8;
  char local_11a1;
  QLatin1String local_11a0;
  char local_1189;
  QLatin1String local_1188;
  char local_1171;
  QLatin1String local_1170;
  char local_1159;
  QLatin1String local_1158;
  char local_1141;
  QLatin1String local_1140;
  char local_1129;
  QLatin1String local_1128;
  char local_1111;
  QLatin1String local_1110;
  char local_10f9;
  QLatin1String local_10f8;
  char local_10e1;
  QLatin1String local_10e0;
  char local_10c9;
  QLatin1String local_10c8;
  char local_10b1;
  QLatin1String local_10b0;
  char local_1099;
  QLatin1String local_1098;
  char local_1081;
  QLatin1String local_1080;
  char local_1069;
  QLatin1String local_1068;
  char local_1051;
  QLatin1String local_1050;
  char local_1039;
  QLatin1String local_1038;
  char local_1021;
  QLatin1String local_1020;
  char local_1009;
  pair<char,_QLatin1String> local_1008;
  pair<char,_QLatin1String> pStack_ff0;
  pair<char,_QLatin1String> pStack_fd8;
  pair<char,_QLatin1String> pStack_fc0;
  pair<char,_QLatin1String> pStack_fa8;
  pair<char,_QLatin1String> pStack_f90;
  pair<char,_QLatin1String> pStack_f78;
  pair<char,_QLatin1String> pStack_f60;
  pair<char,_QLatin1String> pStack_f48;
  pair<char,_QLatin1String> pStack_f30;
  pair<char,_QLatin1String> pStack_f18;
  pair<char,_QLatin1String> pStack_f00;
  pair<char,_QLatin1String> pStack_ee8;
  pair<char,_QLatin1String> pStack_ed0;
  pair<char,_QLatin1String> pStack_eb8;
  pair<char,_QLatin1String> pStack_ea0;
  pair<char,_QLatin1String> pStack_e88;
  pair<char,_QLatin1String> pStack_e70;
  pair<char,_QLatin1String> pStack_e58;
  pair<char,_QLatin1String> pStack_e40;
  pair<char,_QLatin1String> pStack_e28;
  pair<char,_QLatin1String> pStack_e10;
  pair<char,_QLatin1String> pStack_df8;
  pair<char,_QLatin1String> pStack_de0;
  pair<char,_QLatin1String> pStack_dc8;
  pair<char,_QLatin1String> pStack_db0;
  pair<char,_QLatin1String> pStack_d98;
  pair<char,_QLatin1String> pStack_d80;
  pair<char,_QLatin1String> pStack_d68;
  pair<char,_QLatin1String> pStack_d50;
  pair<char,_QLatin1String> pStack_d38;
  pair<char,_QLatin1String> pStack_d20;
  pair<char,_QLatin1String> pStack_d08;
  pair<char,_QLatin1String> pStack_cf0;
  pair<char,_QLatin1String> pStack_cd8;
  pair<char,_QLatin1String> pStack_cc0;
  pair<char,_QLatin1String> pStack_ca8;
  pair<char,_QLatin1String> pStack_c90;
  pair<char,_QLatin1String> pStack_c78;
  pair<char,_QLatin1String> pStack_c60;
  pair<char,_QLatin1String> pStack_c48;
  pair<char,_QLatin1String> pStack_c30;
  pair<char,_QLatin1String> pStack_c18;
  pair<char,_QLatin1String> pStack_c00;
  pair<char,_QLatin1String> pStack_be8;
  pair<char,_QLatin1String> pStack_bd0;
  pair<char,_QLatin1String> pStack_bb8;
  pair<char,_QLatin1String> pStack_ba0;
  pair<char,_QLatin1String> pStack_b88;
  pair<char,_QLatin1String> pStack_b70;
  pair<char,_QLatin1String> pStack_b58;
  pair<char,_QLatin1String> pStack_b40;
  pair<char,_QLatin1String> pStack_b28;
  pair<char,_QLatin1String> pStack_b10;
  pair<char,_QLatin1String> pStack_af8;
  pair<char,_QLatin1String> pStack_ae0;
  pair<char,_QLatin1String> pStack_ac8;
  pair<char,_QLatin1String> pStack_ab0;
  pair<char,_QLatin1String> pStack_a98;
  pair<char,_QLatin1String> pStack_a80;
  pair<char,_QLatin1String> pStack_a68;
  pair<char,_QLatin1String> pStack_a50;
  pair<char,_QLatin1String> pStack_a38;
  pair<char,_QLatin1String> pStack_a20;
  pair<char,_QLatin1String> pStack_a08;
  pair<char,_QLatin1String> pStack_9f0;
  pair<char,_QLatin1String> pStack_9d8;
  pair<char,_QLatin1String> pStack_9c0;
  pair<char,_QLatin1String> pStack_9a8;
  pair<char,_QLatin1String> pStack_990;
  pair<char,_QLatin1String> pStack_978;
  pair<char,_QLatin1String> pStack_960;
  pair<char,_QLatin1String> pStack_948;
  pair<char,_QLatin1String> pStack_930;
  pair<char,_QLatin1String> pStack_918;
  pair<char,_QLatin1String> pStack_900;
  pair<char,_QLatin1String> pStack_8e8;
  pair<char,_QLatin1String> pStack_8d0;
  pair<char,_QLatin1String> pStack_8b8;
  pair<char,_QLatin1String> pStack_8a0;
  pair<char,_QLatin1String> pStack_888;
  pair<char,_QLatin1String> pStack_870;
  pair<char,_QLatin1String> pStack_858;
  pair<char,_QLatin1String> pStack_840;
  pair<char,_QLatin1String> pStack_828;
  pair<char,_QLatin1String> pStack_810;
  pair<char,_QLatin1String> pStack_7f8;
  pair<char,_QLatin1String> pStack_7e0;
  pair<char,_QLatin1String> pStack_7c8;
  pair<char,_QLatin1String> pStack_7b0;
  pair<char,_QLatin1String> pStack_798;
  pair<char,_QLatin1String> pStack_780;
  pair<char,_QLatin1String> pStack_768;
  pair<char,_QLatin1String> pStack_750;
  pair<char,_QLatin1String> pStack_738;
  pair<char,_QLatin1String> pStack_720;
  pair<char,_QLatin1String> pStack_708;
  pair<char,_QLatin1String> pStack_6f0;
  pair<char,_QLatin1String> pStack_6d8;
  pair<char,_QLatin1String> pStack_6c0;
  pair<char,_QLatin1String> pStack_6a8;
  pair<char,_QLatin1String> pStack_690;
  pair<char,_QLatin1String> pStack_678;
  pair<char,_QLatin1String> pStack_660;
  pair<char,_QLatin1String> pStack_648;
  pair<char,_QLatin1String> pStack_630;
  pair<char,_QLatin1String> pStack_618;
  pair<char,_QLatin1String> pStack_600;
  pair<char,_QLatin1String> pStack_5e8;
  pair<char,_QLatin1String> pStack_5d0;
  pair<char,_QLatin1String> pStack_5b8;
  pair<char,_QLatin1String> pStack_5a0;
  pair<char,_QLatin1String> pStack_588;
  pair<char,_QLatin1String> pStack_570;
  pair<char,_QLatin1String> pStack_558;
  pair<char,_QLatin1String> pStack_540;
  pair<char,_QLatin1String> pStack_528;
  pair<char,_QLatin1String> pStack_510;
  pair<char,_QLatin1String> pStack_4f8;
  pair<char,_QLatin1String> pStack_4e0;
  pair<char,_QLatin1String> pStack_4c8;
  pair<char,_QLatin1String> pStack_4b0;
  pair<char,_QLatin1String> pStack_498;
  pair<char,_QLatin1String> pStack_480;
  pair<char,_QLatin1String> pStack_468;
  pair<char,_QLatin1String> pStack_450;
  pair<char,_QLatin1String> pStack_438;
  pair<char,_QLatin1String> pStack_420;
  pair<char,_QLatin1String> pStack_408;
  pair<char,_QLatin1String> pStack_3f0;
  pair<char,_QLatin1String> pStack_3d8;
  pair<char,_QLatin1String> pStack_3c0;
  pair<char,_QLatin1String> pStack_3a8;
  pair<char,_QLatin1String> pStack_390;
  pair<char,_QLatin1String> pStack_378;
  pair<char,_QLatin1String> pStack_360;
  iterator local_348;
  undefined8 local_340;
  QMultiHash<char,_QLatin1String> local_338;
  QLatin1String local_328;
  char local_311;
  QLatin1String local_310;
  char local_2f9;
  pair<char,_QLatin1String> local_2f8;
  pair<char,_QLatin1String> pStack_2e0;
  iterator local_2c8;
  undefined8 local_2c0;
  QMultiHash<char,_QLatin1String> local_2b8;
  QMultiHash<char,_QLatin1String> local_2a8;
  QLatin1String local_298;
  char local_281;
  QLatin1String local_280;
  char local_269;
  QLatin1String local_268;
  char local_251;
  QLatin1String local_250;
  char local_239;
  QLatin1String local_238;
  char local_221;
  QLatin1String local_220;
  char local_209;
  QLatin1String local_208;
  char local_1f1;
  QLatin1String local_1f0;
  char local_1d9;
  QLatin1String local_1d8;
  char local_1c1;
  QLatin1String local_1c0;
  char local_1a9;
  QLatin1String local_1a8;
  char local_191;
  QLatin1String local_190;
  char local_179;
  QLatin1String local_178;
  char local_161;
  pair<char,_QLatin1String> local_160;
  pair<char,_QLatin1String> pStack_148;
  pair<char,_QLatin1String> pStack_130;
  pair<char,_QLatin1String> pStack_118;
  pair<char,_QLatin1String> pStack_100;
  pair<char,_QLatin1String> pStack_e8;
  pair<char,_QLatin1String> pStack_d0;
  pair<char,_QLatin1String> pStack_b8;
  pair<char,_QLatin1String> pStack_a0;
  pair<char,_QLatin1String> pStack_88;
  pair<char,_QLatin1String> pStack_70;
  pair<char,_QLatin1String> pStack_58;
  pair<char,_QLatin1String> pStack_40;
  iterator local_28;
  undefined8 local_20;
  QMultiHash<char,_QLatin1String> local_18;
  
  local_161 = 'i';
  QLatin1String::QLatin1String(&local_178,"if");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_160,&local_161,&local_178);
  local_179 = 't';
  QLatin1String::QLatin1String(&local_190,"then");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_148,&local_179,&local_190)
  ;
  local_191 = 'e';
  QLatin1String::QLatin1String(&local_1a8,"else");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_130,&local_191,&local_1a8)
  ;
  local_1a9 = 'e';
  QLatin1String::QLatin1String(&local_1c0,"elif");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_118,&local_1a9,&local_1c0)
  ;
  local_1c1 = 'f';
  QLatin1String::QLatin1String(&local_1d8,"fi");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_100,&local_1c1,&local_1d8)
  ;
  local_1d9 = 'f';
  QLatin1String::QLatin1String(&local_1f0,"for");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e8,&local_1d9,&local_1f0);
  local_1f1 = 'w';
  QLatin1String::QLatin1String(&local_208,"while");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_d0,&local_1f1,&local_208);
  local_209 = 'i';
  QLatin1String::QLatin1String(&local_220,"in");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b8,&local_209,&local_220);
  local_221 = 'd';
  QLatin1String::QLatin1String(&local_238,"do");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a0,&local_221,&local_238);
  local_239 = 'd';
  QLatin1String::QLatin1String(&local_250,"done");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_88,&local_239,&local_250);
  local_251 = 'c';
  QLatin1String::QLatin1String(&local_268,"case");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_70,&local_251,&local_268);
  local_269 = 'e';
  QLatin1String::QLatin1String(&local_280,"esac");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_58,&local_269,&local_280);
  local_281 = 'f';
  QLatin1String::QLatin1String(&local_298,"function");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_40,&local_281,&local_298);
  local_28 = &local_160;
  local_20 = 0xd;
  list_01._M_len = 0xd;
  list_01._M_array = local_28;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_18,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&shell_keywords,&local_18);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_18);
  memset(&local_2a8,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_2a8);
  QMultiHash<char,_QLatin1String>::operator=(&shell_types,&local_2a8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_2a8);
  local_2f9 = 'f';
  QLatin1String::QLatin1String(&local_310,"false");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_2f8,&local_2f9,&local_310);
  local_311 = 't';
  QLatin1String::QLatin1String(&local_328,"true");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2e0,&local_311,&local_328)
  ;
  local_2c8 = &local_2f8;
  local_2c0 = 2;
  list_00._M_len = 2;
  list_00._M_array = local_2c8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_2b8,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&shell_literals,&local_2b8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_2b8);
  local_1009 = 'b';
  QLatin1String::QLatin1String(&local_1020,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_1008,&local_1009,&local_1020);
  local_1021 = 'c';
  QLatin1String::QLatin1String(&local_1038,"cd");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ff0,&local_1021,&local_1038);
  local_1039 = 'c';
  QLatin1String::QLatin1String(&local_1050,"continue");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fd8,&local_1039,&local_1050);
  local_1051 = 'e';
  QLatin1String::QLatin1String(&local_1068,"eval");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fc0,&local_1051,&local_1068);
  local_1069 = 'e';
  QLatin1String::QLatin1String(&local_1080,"exec");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fa8,&local_1069,&local_1080);
  local_1081 = 'e';
  QLatin1String::QLatin1String(&local_1098,"exit");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f90,&local_1081,&local_1098);
  local_1099 = 'e';
  QLatin1String::QLatin1String(&local_10b0,"export");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f78,&local_1099,&local_10b0);
  local_10b1 = 'g';
  QLatin1String::QLatin1String(&local_10c8,"getopts");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f60,&local_10b1,&local_10c8);
  local_10c9 = 'h';
  QLatin1String::QLatin1String(&local_10e0,"hash");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f48,&local_10c9,&local_10e0);
  local_10e1 = 'p';
  QLatin1String::QLatin1String(&local_10f8,"pwd");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f30,&local_10e1,&local_10f8);
  local_10f9 = 'r';
  QLatin1String::QLatin1String(&local_1110,"readonly");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f18,&local_10f9,&local_1110);
  local_1111 = 'r';
  QLatin1String::QLatin1String(&local_1128,"return");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f00,&local_1111,&local_1128);
  local_1129 = 's';
  QLatin1String::QLatin1String(&local_1140,"shift");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ee8,&local_1129,&local_1140);
  local_1141 = 't';
  QLatin1String::QLatin1String(&local_1158,"test");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ed0,&local_1141,&local_1158);
  local_1159 = 't';
  QLatin1String::QLatin1String(&local_1170,"timestrap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_eb8,&local_1159,&local_1170);
  local_1171 = 'u';
  QLatin1String::QLatin1String(&local_1188,"umask");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ea0,&local_1171,&local_1188);
  local_1189 = 'u';
  QLatin1String::QLatin1String(&local_11a0,"unset");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e88,&local_1189,&local_11a0);
  local_11a1 = 'B';
  QLatin1String::QLatin1String(&local_11b8,"Bash");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e70,&local_11a1,&local_11b8);
  local_11b9 = 'a';
  QLatin1String::QLatin1String(&local_11d0,"alias");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e58,&local_11b9,&local_11d0);
  local_11d1 = 'b';
  QLatin1String::QLatin1String(&local_11e8,"bind");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e40,&local_11d1,&local_11e8);
  local_11e9 = 'b';
  QLatin1String::QLatin1String(&local_1200,"builtin");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e28,&local_11e9,&local_1200);
  local_1201 = 'c';
  QLatin1String::QLatin1String(&local_1218,"caller");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e10,&local_1201,&local_1218);
  local_1219 = 'c';
  QLatin1String::QLatin1String(&local_1230,"command");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_df8,&local_1219,&local_1230);
  local_1231 = 'd';
  QLatin1String::QLatin1String(&local_1248,"declare");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_de0,&local_1231,&local_1248);
  local_1249 = 'e';
  QLatin1String::QLatin1String(&local_1260,"echo");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_dc8,&local_1249,&local_1260);
  local_1261 = 'e';
  QLatin1String::QLatin1String(&local_1278,"enable");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_db0,&local_1261,&local_1278);
  local_1279 = 'h';
  QLatin1String::QLatin1String(&local_1290,"help");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d98,&local_1279,&local_1290);
  local_1291 = 'l';
  QLatin1String::QLatin1String(&local_12a8,"let");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d80,&local_1291,&local_12a8);
  local_12a9 = 'l';
  QLatin1String::QLatin1String(&local_12c0,"local");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d68,&local_12a9,&local_12c0);
  local_12c1 = 'l';
  QLatin1String::QLatin1String(&local_12d8,"logout");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d50,&local_12c1,&local_12d8);
  local_12d9 = 'm';
  QLatin1String::QLatin1String(&local_12f0,"mapfile");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d38,&local_12d9,&local_12f0);
  local_12f1 = 'p';
  QLatin1String::QLatin1String(&local_1308,"printfread");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d20,&local_12f1,&local_1308);
  local_1309 = 'r';
  QLatin1String::QLatin1String(&local_1320,"readarray");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d08,&local_1309,&local_1320);
  local_1321 = 's';
  QLatin1String::QLatin1String(&local_1338,"source");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cf0,&local_1321,&local_1338);
  local_1339 = 't';
  QLatin1String::QLatin1String(&local_1350,"type");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cd8,&local_1339,&local_1350);
  local_1351 = 't';
  QLatin1String::QLatin1String(&local_1368,"typeset");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cc0,&local_1351,&local_1368);
  local_1369 = 'u';
  QLatin1String::QLatin1String(&local_1380,"ulimit");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ca8,&local_1369,&local_1380);
  local_1381 = 'u';
  QLatin1String::QLatin1String(&local_1398,"unalias");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c90,&local_1381,&local_1398);
  local_1399 = 'm';
  QLatin1String::QLatin1String(&local_13b0,"modifiers");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c78,&local_1399,&local_13b0);
  local_13b1 = 's';
  QLatin1String::QLatin1String(&local_13c8,"set");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c60,&local_13b1,&local_13c8);
  local_13c9 = 's';
  QLatin1String::QLatin1String(&local_13e0,"shopt");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c48,&local_13c9,&local_13e0);
  local_13e1 = 'a';
  QLatin1String::QLatin1String(&local_13f8,"autoload");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c30,&local_13e1,&local_13f8);
  local_13f9 = 'b';
  QLatin1String::QLatin1String(&local_1410,"bg");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c18,&local_13f9,&local_1410);
  local_1411 = 'b';
  QLatin1String::QLatin1String(&local_1428,"bindkey");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c00,&local_1411,&local_1428);
  local_1429 = 'b';
  QLatin1String::QLatin1String(&local_1440,"bye");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_be8,&local_1429,&local_1440);
  local_1441 = 'c';
  QLatin1String::QLatin1String(&local_1458,"cap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bd0,&local_1441,&local_1458);
  local_1459 = 'c';
  QLatin1String::QLatin1String(&local_1470,"chdir");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bb8,&local_1459,&local_1470);
  local_1471 = 'c';
  QLatin1String::QLatin1String(&local_1488,"clone");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ba0,&local_1471,&local_1488);
  local_1489 = 'c';
  QLatin1String::QLatin1String(&local_14a0,"comparguments");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b88,&local_1489,&local_14a0);
  local_14a1 = 'c';
  QLatin1String::QLatin1String(&local_14b8,"compcall");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b70,&local_14a1,&local_14b8);
  local_14b9 = 'c';
  QLatin1String::QLatin1String(&local_14d0,"compctl");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b58,&local_14b9,&local_14d0);
  local_14d1 = 'c';
  QLatin1String::QLatin1String(&local_14e8,"compdescribe");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b40,&local_14d1,&local_14e8);
  local_14e9 = 'c';
  QLatin1String::QLatin1String(&local_1500,"compfilescompgroups");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b28,&local_14e9,&local_1500);
  local_1501 = 'c';
  QLatin1String::QLatin1String(&local_1518,"compquote");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b10,&local_1501,&local_1518);
  local_1519 = 'c';
  QLatin1String::QLatin1String(&local_1530,"comptags");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_af8,&local_1519,&local_1530);
  local_1531 = 'c';
  QLatin1String::QLatin1String(&local_1548,"comptry");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ae0,&local_1531,&local_1548);
  local_1549 = 'c';
  QLatin1String::QLatin1String(&local_1560,"compvalues");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ac8,&local_1549,&local_1560);
  local_1561 = 'd';
  QLatin1String::QLatin1String(&local_1578,"dirs");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ab0,&local_1561,&local_1578);
  local_1579 = 'd';
  QLatin1String::QLatin1String(&local_1590,"disable");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a98,&local_1579,&local_1590);
  local_1591 = 'd';
  QLatin1String::QLatin1String(&local_15a8,"disown");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a80,&local_1591,&local_15a8);
  local_15a9 = 'e';
  QLatin1String::QLatin1String(&local_15c0,"echotc");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a68,&local_15a9,&local_15c0);
  local_15c1 = 'e';
  QLatin1String::QLatin1String(&local_15d8,"echoti");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a50,&local_15c1,&local_15d8);
  local_15d9 = 'e';
  QLatin1String::QLatin1String(&local_15f0,"emulatefc");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a38,&local_15d9,&local_15f0);
  local_15f1 = 'f';
  QLatin1String::QLatin1String(&local_1608,"fg");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a20,&local_15f1,&local_1608);
  local_1609 = 'f';
  QLatin1String::QLatin1String(&local_1620,"float");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a08,&local_1609,&local_1620);
  local_1621 = 'f';
  QLatin1String::QLatin1String(&local_1638,"functions");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9f0,&local_1621,&local_1638);
  local_1639 = 'g';
  QLatin1String::QLatin1String(&local_1650,"getcap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9d8,&local_1639,&local_1650);
  local_1651 = 'g';
  QLatin1String::QLatin1String(&local_1668,"getln");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9c0,&local_1651,&local_1668);
  local_1669 = 'h';
  QLatin1String::QLatin1String(&local_1680,"history");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9a8,&local_1669,&local_1680);
  local_1681 = 'i';
  QLatin1String::QLatin1String(&local_1698,"integer");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_990,&local_1681,&local_1698);
  local_1699 = 'j';
  QLatin1String::QLatin1String(&local_16b0,"jobs");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_978,&local_1699,&local_16b0);
  local_16b1 = 'k';
  QLatin1String::QLatin1String(&local_16c8,"kill");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_960,&local_16b1,&local_16c8);
  local_16c9 = 'l';
  QLatin1String::QLatin1String(&local_16e0,"limit");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_948,&local_16c9,&local_16e0);
  local_16e1 = 'l';
  QLatin1String::QLatin1String(&local_16f8,"log");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_930,&local_16e1,&local_16f8);
  local_16f9 = 'n';
  QLatin1String::QLatin1String(&local_1710,"noglob");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_918,&local_16f9,&local_1710);
  local_1711 = 'p';
  QLatin1String::QLatin1String(&local_1728,"popd");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_900,&local_1711,&local_1728);
  local_1729 = 'p';
  QLatin1String::QLatin1String(&local_1740,"printpushd");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8e8,&local_1729,&local_1740);
  local_1741 = 'p';
  QLatin1String::QLatin1String(&local_1758,"pushln");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8d0,&local_1741,&local_1758);
  local_1759 = 'r';
  QLatin1String::QLatin1String(&local_1770,"rehash");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8b8,&local_1759,&local_1770);
  local_1771 = 's';
  QLatin1String::QLatin1String(&local_1788,"sched");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8a0,&local_1771,&local_1788);
  local_1789 = 's';
  QLatin1String::QLatin1String(&local_17a0,"setcap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_888,&local_1789,&local_17a0);
  local_17a1 = 's';
  QLatin1String::QLatin1String(&local_17b8,"setopt");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_870,&local_17a1,&local_17b8);
  local_17b9 = 's';
  QLatin1String::QLatin1String(&local_17d0,"stat");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_858,&local_17b9,&local_17d0);
  local_17d1 = 's';
  QLatin1String::QLatin1String(&local_17e8,"suspend");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_840,&local_17d1,&local_17e8);
  local_17e9 = 't';
  QLatin1String::QLatin1String(&local_1800,"ttyctl");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_828,&local_17e9,&local_1800);
  local_1801 = 'u';
  QLatin1String::QLatin1String(&local_1818,"unfunction");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_810,&local_1801,&local_1818);
  local_1819 = 'u';
  QLatin1String::QLatin1String(&local_1830,"unhash");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7f8,&local_1819,&local_1830);
  local_1831 = 'u';
  QLatin1String::QLatin1String(&local_1848,"unlimitunsetopt");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7e0,&local_1831,&local_1848);
  local_1849 = 'v';
  QLatin1String::QLatin1String(&local_1860,"vared");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7c8,&local_1849,&local_1860);
  local_1861 = 'w';
  QLatin1String::QLatin1String(&local_1878,"wait");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7b0,&local_1861,&local_1878);
  local_1879 = 'w';
  QLatin1String::QLatin1String(&local_1890,"whence");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_798,&local_1879,&local_1890);
  local_1891 = 'w';
  QLatin1String::QLatin1String(&local_18a8,"where");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_780,&local_1891,&local_18a8);
  local_18a9 = 'w';
  QLatin1String::QLatin1String(&local_18c0,"which");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_768,&local_18a9,&local_18c0);
  local_18c1 = 'z';
  QLatin1String::QLatin1String(&local_18d8,"zcompile");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_750,&local_18c1,&local_18d8);
  local_18d9 = 'z';
  QLatin1String::QLatin1String(&local_18f0,"zformat");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_738,&local_18d9,&local_18f0);
  local_18f1 = 'z';
  QLatin1String::QLatin1String(&local_1908,"zftp");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_720,&local_18f1,&local_1908);
  local_1909 = 'z';
  QLatin1String::QLatin1String(&local_1920,"zle");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_708,&local_1909,&local_1920);
  local_1921 = 'z';
  QLatin1String::QLatin1String(&local_1938,"zmodload");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6f0,&local_1921,&local_1938);
  local_1939 = 'z';
  QLatin1String::QLatin1String(&local_1950,"zparseopts");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6d8,&local_1939,&local_1950);
  local_1951 = 'z';
  QLatin1String::QLatin1String(&local_1968,"zprof");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6c0,&local_1951,&local_1968);
  local_1969 = 'z';
  QLatin1String::QLatin1String(&local_1980,"zpty");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6a8,&local_1969,&local_1980);
  local_1981 = 'z';
  QLatin1String::QLatin1String(&local_1998,"zregexparse");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_690,&local_1981,&local_1998);
  local_1999 = 'z';
  QLatin1String::QLatin1String(&local_19b0,"zsocket");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_678,&local_1999,&local_19b0);
  local_19b1 = 'z';
  QLatin1String::QLatin1String(&local_19c8,"zstyle");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_660,&local_19b1,&local_19c8);
  local_19c9 = 'z';
  QLatin1String::QLatin1String(&local_19e0,"ztcp");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_648,&local_19c9,&local_19e0);
  local_19e1 = 'g';
  QLatin1String::QLatin1String(&local_19f8,"git");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_630,&local_19e1,&local_19f8);
  local_19f9 = 'r';
  QLatin1String::QLatin1String(&local_1a10,"rm");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_618,&local_19f9,&local_1a10);
  local_1a11 = 's';
  QLatin1String::QLatin1String(&local_1a28,"sudo");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_600,&local_1a11,&local_1a28);
  local_1a29 = 'f';
  QLatin1String::QLatin1String(&local_1a40,"fdisk");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5e8,&local_1a29,&local_1a40);
  local_1a41 = 'a';
  QLatin1String::QLatin1String(&local_1a58,"apt");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5d0,&local_1a41,&local_1a58);
  local_1a59 = 's';
  QLatin1String::QLatin1String(&local_1a70,"snap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5b8,&local_1a59,&local_1a70);
  local_1a71 = 'f';
  QLatin1String::QLatin1String(&local_1a88,"flatpak");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5a0,&local_1a71,&local_1a88);
  local_1a89 = 's';
  QLatin1String::QLatin1String(&local_1aa0,"snapcraft");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_588,&local_1a89,&local_1aa0);
  local_1aa1 = 'y';
  QLatin1String::QLatin1String(&local_1ab8,"yaourt");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_570,&local_1aa1,&local_1ab8);
  local_1ab9 = 'n';
  QLatin1String::QLatin1String(&local_1ad0,"nmcli");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_558,&local_1ab9,&local_1ad0);
  local_1ad1 = 'p';
  QLatin1String::QLatin1String(&local_1ae8,"pacman");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_540,&local_1ad1,&local_1ae8);
  local_1ae9 = 'p';
  QLatin1String::QLatin1String(&local_1b00,"pamac");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_528,&local_1ae9,&local_1b00);
  local_1b01 = 'f';
  QLatin1String::QLatin1String(&local_1b18,"fsck");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_510,&local_1b01,&local_1b18);
  local_1b19 = 'm';
  QLatin1String::QLatin1String(&local_1b30,"mount");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f8,&local_1b19,&local_1b30);
  local_1b31 = 'm';
  QLatin1String::QLatin1String(&local_1b48,"mkdir");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4e0,&local_1b31,&local_1b48);
  local_1b49 = 'm';
  QLatin1String::QLatin1String(&local_1b60,"mkswap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c8,&local_1b49,&local_1b60);
  local_1b61 = 's';
  QLatin1String::QLatin1String(&local_1b78,"sleep");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4b0,&local_1b61,&local_1b78);
  local_1b79 = 'l';
  QLatin1String::QLatin1String(&local_1b90,"ls");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_498,&local_1b79,&local_1b90);
  local_1b91 = 'w';
  QLatin1String::QLatin1String(&local_1ba8,"wget");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_480,&local_1b91,&local_1ba8);
  local_1ba9 = 'k';
  QLatin1String::QLatin1String(&local_1bc0,"kill");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_468,&local_1ba9,&local_1bc0);
  local_1bc1 = 'k';
  QLatin1String::QLatin1String(&local_1bd8,"killall");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_450,&local_1bc1,&local_1bd8);
  local_1bd9 = 'g';
  QLatin1String::QLatin1String(&local_1bf0,"gdb");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_438,&local_1bd9,&local_1bf0);
  local_1bf1 = 'Q';
  QLatin1String::QLatin1String(&local_1c08,"QOwnNotes");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_420,&local_1bf1,&local_1c08);
  local_1c09 = 'q';
  QLatin1String::QLatin1String(&local_1c20,"qownnotes");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_408,&local_1c09,&local_1c20);
  local_1c21 = 'd';
  QLatin1String::QLatin1String(&local_1c38,"docker");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3f0,&local_1c21,&local_1c38);
  local_1c39 = 'o';
  QLatin1String::QLatin1String(&local_1c50,"openssl");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3d8,&local_1c39,&local_1c50);
  local_1c51 = 'p';
  QLatin1String::QLatin1String(&local_1c68,"php");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3c0,&local_1c51,&local_1c68);
  local_1c69 = 'p';
  QLatin1String::QLatin1String(&local_1c80,"python");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3a8,&local_1c69,&local_1c80);
  local_1c81 = 'p';
  QLatin1String::QLatin1String(&local_1c98,"perl");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_390,&local_1c81,&local_1c98);
  local_1c99 = 'g';
  QLatin1String::QLatin1String(&local_1cb0,"go");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_378,&local_1c99,&local_1cb0);
  local_1cb1 = 'c';
  QLatin1String::QLatin1String(&local_1cc8,"curl");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_360,&local_1cb1,&local_1cc8);
  local_348 = &local_1008;
  local_340 = 0x88;
  list._M_len = 0x88;
  list._M_array = local_348;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_338,list);
  QMultiHash<char,_QLatin1String>::operator=(&shell_builtin,&local_338);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_338);
  memset(&local_1cd8,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_1cd8);
  QMultiHash<char,_QLatin1String>::operator=(&shell_other,&local_1cd8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1cd8);
  return;
}

Assistant:

void initShellData() {
    shell_keywords = {
        {('i'), QLatin1String("if")},      {('t'), QLatin1String("then")},
        {('e'), QLatin1String("else")},    {('e'), QLatin1String("elif")},
        {('f'), QLatin1String("fi")},      {('f'), QLatin1String("for")},
        {('w'), QLatin1String("while")},   {('i'), QLatin1String("in")},
        {('d'), QLatin1String("do")},      {('d'), QLatin1String("done")},
        {('c'), QLatin1String("case")},    {('e'), QLatin1String("esac")},
        {('f'), QLatin1String("function")}};

    shell_types = {};

    shell_literals = {{('f'), QLatin1String("false")},
                      {('t'), QLatin1String("true")}};

    shell_builtin = {{('b'), QLatin1String("break")},
                     {('c'), QLatin1String("cd")},
                     {('c'), QLatin1String("continue")},
                     {('e'), QLatin1String("eval")},
                     {('e'), QLatin1String("exec")},
                     {('e'), QLatin1String("exit")},
                     {('e'), QLatin1String("export")},
                     {('g'), QLatin1String("getopts")},
                     {('h'), QLatin1String("hash")},
                     {('p'), QLatin1String("pwd")},
                     {('r'), QLatin1String("readonly")},
                     {('r'), QLatin1String("return")},
                     {('s'), QLatin1String("shift")},
                     {('t'), QLatin1String("test")},
                     {('t'), QLatin1String("timestrap")},
                     {('u'), QLatin1String("umask")},
                     {('u'), QLatin1String("unset")},
                     {('B'), QLatin1String("Bash")},
                     {('a'), QLatin1String("alias")},
                     {('b'), QLatin1String("bind")},
                     {('b'), QLatin1String("builtin")},
                     {('c'), QLatin1String("caller")},
                     {('c'), QLatin1String("command")},
                     {('d'), QLatin1String("declare")},
                     {('e'), QLatin1String("echo")},
                     {('e'), QLatin1String("enable")},
                     {('h'), QLatin1String("help")},
                     {('l'), QLatin1String("let")},
                     {('l'), QLatin1String("local")},
                     {('l'), QLatin1String("logout")},
                     {('m'), QLatin1String("mapfile")},
                     {('p'), QLatin1String("printfread")},
                     {('r'), QLatin1String("readarray")},
                     {('s'), QLatin1String("source")},
                     {('t'), QLatin1String("type")},
                     {('t'), QLatin1String("typeset")},
                     {('u'), QLatin1String("ulimit")},
                     {('u'), QLatin1String("unalias")},
                     {('m'), QLatin1String("modifiers")},
                     {('s'), QLatin1String("set")},
                     {('s'), QLatin1String("shopt")},
                     {('a'), QLatin1String("autoload")},
                     {('b'), QLatin1String("bg")},
                     {('b'), QLatin1String("bindkey")},
                     {('b'), QLatin1String("bye")},
                     {('c'), QLatin1String("cap")},
                     {('c'), QLatin1String("chdir")},
                     {('c'), QLatin1String("clone")},
                     {('c'), QLatin1String("comparguments")},
                     {('c'), QLatin1String("compcall")},
                     {('c'), QLatin1String("compctl")},
                     {('c'), QLatin1String("compdescribe")},
                     {('c'), QLatin1String("compfilescompgroups")},
                     {('c'), QLatin1String("compquote")},
                     {('c'), QLatin1String("comptags")},
                     {('c'), QLatin1String("comptry")},
                     {('c'), QLatin1String("compvalues")},
                     {('d'), QLatin1String("dirs")},
                     {('d'), QLatin1String("disable")},
                     {('d'), QLatin1String("disown")},
                     {('e'), QLatin1String("echotc")},
                     {('e'), QLatin1String("echoti")},
                     {('e'), QLatin1String("emulatefc")},
                     {('f'), QLatin1String("fg")},
                     {('f'), QLatin1String("float")},
                     {('f'), QLatin1String("functions")},
                     {('g'), QLatin1String("getcap")},
                     {('g'), QLatin1String("getln")},
                     {('h'), QLatin1String("history")},
                     {('i'), QLatin1String("integer")},
                     {('j'), QLatin1String("jobs")},
                     {('k'), QLatin1String("kill")},
                     {('l'), QLatin1String("limit")},
                     {('l'), QLatin1String("log")},
                     {('n'), QLatin1String("noglob")},
                     {('p'), QLatin1String("popd")},
                     {('p'), QLatin1String("printpushd")},
                     {('p'), QLatin1String("pushln")},
                     {('r'), QLatin1String("rehash")},
                     {('s'), QLatin1String("sched")},
                     {('s'), QLatin1String("setcap")},
                     {('s'), QLatin1String("setopt")},
                     {('s'), QLatin1String("stat")},
                     {('s'), QLatin1String("suspend")},
                     {('t'), QLatin1String("ttyctl")},
                     {('u'), QLatin1String("unfunction")},
                     {('u'), QLatin1String("unhash")},
                     {('u'), QLatin1String("unlimitunsetopt")},
                     {('v'), QLatin1String("vared")},
                     {('w'), QLatin1String("wait")},
                     {('w'), QLatin1String("whence")},
                     {('w'), QLatin1String("where")},
                     {('w'), QLatin1String("which")},
                     {('z'), QLatin1String("zcompile")},
                     {('z'), QLatin1String("zformat")},
                     {('z'), QLatin1String("zftp")},
                     {('z'), QLatin1String("zle")},
                     {('z'), QLatin1String("zmodload")},
                     {('z'), QLatin1String("zparseopts")},
                     {('z'), QLatin1String("zprof")},
                     {('z'), QLatin1String("zpty")},
                     {('z'), QLatin1String("zregexparse")},
                     {('z'), QLatin1String("zsocket")},
                     {('z'), QLatin1String("zstyle")},
                     {('z'), QLatin1String("ztcp")},
                     {('g'), QLatin1String("git")},
                     {('r'), QLatin1String("rm")},
                     {('s'), QLatin1String("sudo")},
                     {('f'), QLatin1String("fdisk")},
                     {('a'), QLatin1String("apt")},
                     {('s'), QLatin1String("snap")},
                     {('f'), QLatin1String("flatpak")},
                     {('s'), QLatin1String("snapcraft")},
                     {('y'), QLatin1String("yaourt")},
                     {('n'), QLatin1String("nmcli")},
                     {('p'), QLatin1String("pacman")},
                     {('p'), QLatin1String("pamac")},
                     {('f'), QLatin1String("fsck")},
                     {('m'), QLatin1String("mount")},
                     {('m'), QLatin1String("mkdir")},
                     {('m'), QLatin1String("mkswap")},
                     {('s'), QLatin1String("sleep")},
                     {('l'), QLatin1String("ls")},
                     {('w'), QLatin1String("wget")},
                     {('k'), QLatin1String("kill")},
                     {('k'), QLatin1String("killall")},
                     {('g'), QLatin1String("gdb")},
                     {('Q'), QLatin1String("QOwnNotes")},
                     {('q'), QLatin1String("qownnotes")},
                     {('d'), QLatin1String("docker")},
                     {('o'), QLatin1String("openssl")},
                     {('p'), QLatin1String("php")},
                     {('p'), QLatin1String("python")},
                     {('p'), QLatin1String("perl")},
                     {('g'), QLatin1String("go")},
                     {('c'), QLatin1String("curl")}};

    shell_other = {};
}